

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void verify_basic(archive *a,int seek_checks)

{
  int in_ESI;
  archive_entry *in_RDI;
  int64_t o;
  size_t s;
  void *pv;
  char *buff [128];
  archive_entry *ae;
  archive_entry **in_stack_fffffffffffffbb8;
  archive_entry **ppaVar1;
  archive_entry *paVar2;
  int n;
  archive *in_stack_fffffffffffffbc0;
  uint uVar5;
  char *pcVar3;
  archive *paVar4;
  archive *in_stack_fffffffffffffbc8;
  archive *_a;
  longlong v1;
  undefined4 in_stack_fffffffffffffbd0;
  wchar_t in_stack_fffffffffffffbd4;
  char *in_stack_fffffffffffffbd8;
  wchar_t in_stack_fffffffffffffbe4;
  char *in_stack_fffffffffffffbe8;
  void *in_stack_fffffffffffffbf0;
  archive *in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc00;
  wchar_t in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  char *in_stack_fffffffffffffc10;
  void *in_stack_fffffffffffffc18;
  wchar_t in_stack_fffffffffffffc24;
  char *in_stack_fffffffffffffc28;
  size_t in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  void *in_stack_fffffffffffffc50;
  archive_entry *local_18;
  
  archive_read_next_header(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  paVar2 = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0,
                      (longlong)in_RDI,(char *)0x1b98cd,in_stack_fffffffffffffbf0);
  uVar5 = (uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
  archive_entry_pathname(paVar2);
  paVar4 = (archive *)((ulong)uVar5 << 0x20);
  assertion_equal_string
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (char *)in_stack_fffffffffffffbc8,(char *)paVar4,in_stack_fffffffffffffc00,
             in_stack_fffffffffffffc08);
  archive_entry_mtime(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,0,(char *)0x1b9955,
                      in_stack_fffffffffffffbf0);
  archive_entry_size(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,0,(char *)0x1b9990,
                      in_stack_fffffffffffffbf0);
  if (in_ESI != 0) {
    archive_entry_mode(local_18);
    assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                        (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,0,(char *)0x1b99da,
                        in_stack_fffffffffffffbf0);
  }
  archive_entry_is_encrypted(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,0,(char *)0x1b9a16,
                      in_stack_fffffffffffffbf0);
  archive_read_has_encrypted_entries(in_stack_fffffffffffffbc8);
  paVar2 = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,(longlong)in_RDI,
                      (char *)0x1b9a54,in_stack_fffffffffffffbf0);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (void **)in_stack_fffffffffffffbc8,(size_t *)paVar4,(int64_t *)paVar2);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,(longlong)in_RDI,
                      (char *)0x1b9aa3,in_stack_fffffffffffffbf0);
  ppaVar1 = (archive_entry **)0x0;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,0,(char *)0x1b9ad7,
                      in_stack_fffffffffffffbf0);
  archive_read_next_header(paVar4,ppaVar1);
  paVar2 = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,(char *)paVar4,(longlong)in_RDI,
                      (char *)0x1b9b1e,in_stack_fffffffffffffbf0);
  archive_entry_pathname(paVar2);
  pcVar3 = (char *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (char *)in_stack_fffffffffffffbc8,pcVar3,in_stack_fffffffffffffc00,
             in_stack_fffffffffffffc08);
  archive_entry_mtime(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,pcVar3,0,(char *)0x1b9ba6,
                      in_stack_fffffffffffffbf0);
  if (in_ESI != 0) {
    archive_entry_mode(local_18);
    assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                        (longlong)in_stack_fffffffffffffbc8,pcVar3,0,(char *)0x1b9bf0,
                        in_stack_fffffffffffffbf0);
  }
  archive_entry_size(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,pcVar3,0,(char *)0x1b9c2e,
                      in_stack_fffffffffffffbf0);
  archive_entry_is_encrypted(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,pcVar3,0,(char *)0x1b9c6a,
                      in_stack_fffffffffffffbf0);
  archive_read_has_encrypted_entries(in_stack_fffffffffffffbc8);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,pcVar3,(longlong)in_RDI,(char *)0x1b9ca8,
                      in_stack_fffffffffffffbf0);
  failure("archive_read_data() returns number of bytes read");
  archive_read_data(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                    (size_t)in_stack_fffffffffffffbe8);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                      (longlong)in_stack_fffffffffffffbc8,pcVar3,0,(char *)0x1b9cfe,
                      in_stack_fffffffffffffbf0);
  ppaVar1 = (archive_entry **)0x12;
  paVar4 = (archive *)0x2e6398;
  _a = (archive *)0x0;
  assertion_equal_mem(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,
                      in_stack_fffffffffffffc10,
                      (void *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                      in_stack_fffffffffffffc00,in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
                      in_stack_fffffffffffffc50);
  archive_read_next_header(paVar4,ppaVar1);
  paVar2 = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,
                      (char *)paVar4,(longlong)in_RDI,(char *)0x1b9d90,in_stack_fffffffffffffbf0);
  archive_entry_pathname(paVar2);
  pcVar3 = (char *)((ulong)paVar4 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8,
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),(char *)_a,pcVar3
             ,in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
  archive_entry_mtime(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,0,
                      (char *)0x1b9e18,in_stack_fffffffffffffbf0);
  archive_entry_is_encrypted(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,0,
                      (char *)0x1b9e54,in_stack_fffffffffffffbf0);
  archive_read_has_encrypted_entries(_a);
  paVar2 = in_RDI;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,
                      (longlong)in_RDI,(char *)0x1b9e92,in_stack_fffffffffffffbf0);
  if (in_ESI != 0) {
    archive_entry_mode(local_18);
    paVar2 = (archive_entry *)0x0;
    assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,0,
                        (char *)0x1b9edc,in_stack_fffffffffffffbf0);
  }
  archive_entry_size_is_set(local_18);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,pcVar3,paVar2);
  archive_entry_size(local_18);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,0,
                      (char *)0x1b9f46,in_stack_fffffffffffffbf0);
  failure("file2 has a bad CRC, so read should fail and not change buff");
  memset(&stack0xfffffffffffffbe8,0x61,0x13);
  archive_read_data(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                    (size_t)in_stack_fffffffffffffbe8);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,(longlong)_a,pcVar3,0,
                      (char *)0x1b9fb2,in_stack_fffffffffffffbf0);
  ppaVar1 = (archive_entry **)0x13;
  paVar4 = (archive *)0x2e7b90;
  v1 = 0;
  assertion_equal_mem(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,
                      in_stack_fffffffffffffc10,
                      (void *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                      in_stack_fffffffffffffc00,in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
                      in_stack_fffffffffffffc50);
  archive_read_next_header(paVar4,ppaVar1);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,0,
                      (char *)0x1ba043,in_stack_fffffffffffffbf0);
  failure("the archive file has three files");
  archive_file_count((archive *)in_RDI);
  n = 0;
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,0,
                      (char *)0x1ba08f,in_stack_fffffffffffffbf0);
  archive_filter_code(paVar4,n);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,
                      (longlong)in_RDI,(char *)0x1ba0d0,in_stack_fffffffffffffbf0);
  archive_format((archive *)in_RDI);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,
                      (longlong)in_RDI,(char *)0x1ba110,in_stack_fffffffffffffbf0);
  archive_read_close((archive *)0x1ba11d);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,
                      (longlong)in_RDI,(char *)0x1ba14f,in_stack_fffffffffffffbf0);
  archive_read_free((archive *)0x1ba15c);
  assertion_equal_int(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,v1,(char *)paVar4,0,
                      (char *)0x1ba18a,in_stack_fffffffffffffbf0);
  return;
}

Assistant:

static void
verify_basic(struct archive *a, int seek_checks)
{
	struct archive_entry *ae;
	char *buff[128];
	const void *pv;
	size_t s;
	int64_t o;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(1179604249, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_size(ae));
	if (seek_checks)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt((int)s, 0);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(1179604289, archive_entry_mtime(ae));
	if (seek_checks)
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(18, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	failure("archive_read_data() returns number of bytes read");
	if (libz_enabled) {
		assertEqualInt(18, archive_read_data(a, buff, 19));
		assertEqualMem(buff, "hello\nhello\nhello\n", 18);
	} else {
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(1179605932, archive_entry_mtime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	if (seek_checks) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	assert(archive_entry_size_is_set(ae));
	assertEqualInt(18, archive_entry_size(ae));
	if (libz_enabled) {
		failure("file2 has a bad CRC, so read should fail and not change buff");
		memset(buff, 'a', 19);
		assertEqualInt(ARCHIVE_WARN, archive_read_data(a, buff, 19));
		assertEqualMem(buff, "aaaaaaaaaaaaaaaaaaa", 19);
	} else {
		assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, 19));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));
	/* Verify the number of files read. */
	failure("the archive file has three files");
	assertEqualInt(3, archive_file_count(a));
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}